

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask14_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0xe | *out;
  *out = in[2] << 0x1c | *out;
  puVar1 = out + 1;
  *puVar1 = in[2] >> 4;
  *puVar1 = in[3] << 10 | *puVar1;
  *puVar1 = in[4] << 0x18 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[4] >> 8;
  *puVar1 = in[5] << 6 | *puVar1;
  *puVar1 = in[6] << 0x14 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[6] >> 0xc;
  *puVar1 = in[7] << 2 | *puVar1;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask14_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;

  return out + 1;
}